

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.cc
# Opt level: O1

Edge * __thiscall State::AddEdge(State *this,Rule *rule)

{
  pointer *pppEVar1;
  iterator __position;
  Edge *edge;
  Edge *local_18;
  
  local_18 = (Edge *)operator_new(0x88);
  local_18->rule_ = (Rule *)0x0;
  local_18->pool_ = (Pool *)0x0;
  (local_18->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (local_18->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_18->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_18->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (local_18->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_18->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_18->validations_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (local_18->validations_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_18->validations_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_18->dyndep_ = (Node *)0x0;
  *(undefined8 *)((long)&local_18->dyndep_ + 4) = 0;
  *(undefined8 *)((long)&local_18->env_ + 4) = 0;
  local_18->id_ = 0;
  local_18->outputs_ready_ = false;
  local_18->deps_loaded_ = false;
  local_18->deps_missing_ = false;
  local_18->generated_by_dep_loader_ = false;
  local_18->implicit_deps_ = 0;
  local_18->order_only_deps_ = 0;
  local_18->implicit_outs_ = 0;
  local_18->rule_ = rule;
  local_18->pool_ = &kDefaultPool;
  local_18->env_ = &this->bindings_;
  __position._M_current =
       (this->edges_).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_18->id_ =
       (long)__position._M_current -
       (long)(this->edges_).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
             super__Vector_impl_data._M_start >> 3;
  if (__position._M_current ==
      (this->edges_).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<Edge*,std::allocator<Edge*>>::_M_realloc_insert<Edge*const&>
              ((vector<Edge*,std::allocator<Edge*>> *)&this->edges_,__position,&local_18);
  }
  else {
    *__position._M_current = local_18;
    pppEVar1 = &(this->edges_).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppEVar1 = *pppEVar1 + 1;
  }
  return local_18;
}

Assistant:

Edge* State::AddEdge(const Rule* rule) {
  Edge* edge = new Edge();
  edge->rule_ = rule;
  edge->pool_ = &State::kDefaultPool;
  edge->env_ = &bindings_;
  edge->id_ = edges_.size();
  edges_.push_back(edge);
  return edge;
}